

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O0

string * __thiscall OpenMD::ElementsTable::GetName_abi_cxx11_(ElementsTable *this,int atomicnum)

{
  size_type sVar1;
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  ElementsTable *in_stack_000080a0;
  Element *in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = in_RSI;
  if (((byte)in_RSI->_M_dataplus & 1) == 0) {
    Init(in_stack_000080a0);
  }
  iVar2 = in_EDX;
  if ((-1 < in_EDX) &&
     (sVar1 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::size
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         &in_RSI[4]._M_string_length), in_EDX < (int)sVar1)) {
    std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::operator[]
              ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
               &in_RSI[4]._M_string_length,(long)iVar2);
    Element::GetName_abi_cxx11_(in_stack_ffffffffffffffa8);
    return in_RDI;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffeb);
  return in_RDI;
}

Assistant:

std::string ElementsTable::GetName(int atomicnum) {
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return ("Unknown");

    return (elements_[atomicnum]->GetName());
  }